

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_ctzi_i64_riscv32
               (TCGContext_conflict9 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,uint64_t arg2)

{
  TCGv_i64 arg2_00;
  TCGv_i64 t64;
  uint64_t arg2_local;
  TCGv_i64 arg1_local;
  TCGv_i64 ret_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  arg2_00 = tcg_const_i64_riscv32(tcg_ctx,arg2);
  tcg_gen_ctz_i64_riscv32(tcg_ctx,ret,arg1,arg2_00);
  tcg_temp_free_i64(tcg_ctx,arg2_00);
  return;
}

Assistant:

void tcg_gen_ctzi_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, uint64_t arg2)
{
#if TCG_TARGET_REG_BITS == 32 && TCG_TARGET_HAS_ctz_i32
    if (arg2 <= 0xffffffffu) {
        TCGv_i32 t32 = tcg_const_i32(tcg_ctx, (uint32_t)arg2 - 32);
        tcg_gen_ctz_i32(tcg_ctx, t32, TCGV_HIGH(tcg_ctx, arg1), t32);
        tcg_gen_addi_i32(tcg_ctx, t32, t32, 32);
        tcg_gen_ctz_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, arg1), t32);
        tcg_gen_movi_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), 0);
        tcg_temp_free_i32(tcg_ctx, t32);
    } else
#endif
#if !TCG_TARGET_HAS_ctz_i64 && TCG_TARGET_HAS_ctpop_i64
    if (arg2 == 64) {
        /* This equivalence has the advantage of not requiring a fixup.  */
        TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_subi_i64(tcg_ctx, t, arg1, 1);
        tcg_gen_andc_i64(tcg_ctx, t, t, arg1);
        tcg_gen_ctpop_i64(tcg_ctx, ret, t);
        tcg_temp_free_i64(tcg_ctx, t);
    } else
#endif
    {
        TCGv_i64 t64 = tcg_const_i64(tcg_ctx, arg2);
        tcg_gen_ctz_i64(tcg_ctx, ret, arg1, t64);
        tcg_temp_free_i64(tcg_ctx, t64);
    }
}